

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

void __thiscall nnad::Matrix<double>::operator=(Matrix<double> *this,Matrix<double> *term)

{
  int iVar1;
  vector<double,_std::allocator<double>_> local_28;
  
  iVar1 = term->_Columns;
  this->_Lines = term->_Lines;
  this->_Columns = iVar1;
  std::vector<double,_std::allocator<double>_>::vector(&local_28,&term->_Matrix);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->_Matrix,&local_28);
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void operator = (Matrix<T> const& term)
    {
      _Lines   = term.GetLines();
      _Columns = term.GetColumns();
      _Matrix  = term.GetVector();
    }